

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::unset_execution_mode(Compiler *this,ExecutionMode mode)

{
  SPIREntryPoint *pSVar1;
  
  pSVar1 = get_entry_point(this);
  Bitset::clear(&pSVar1->flags,mode);
  return;
}

Assistant:

void Compiler::unset_execution_mode(ExecutionMode mode)
{
	auto &execution = get_entry_point();
	execution.flags.clear(mode);
}